

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsumst.hpp
# Opt level: O0

void __thiscall
soplex::SPxSumST<double>::setupWeights(SPxSumST<double> *this,SPxSolverBase<double> *base)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double *low;
  double *up;
  double *rhs;
  double *lhs;
  double *wrk;
  VectorBase<double> rowLen;
  VectorBase<double> delta;
  VectorBase<double> work;
  double x;
  int i;
  int count;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  SPxLPBase<double> *in_stack_fffffffffffffe70;
  VectorBase<double> *in_stack_fffffffffffffe78;
  SVectorBase<double> *in_stack_fffffffffffffe80;
  SVectorBase<double> *in_stack_fffffffffffffe88;
  VectorBase<double> *in_stack_fffffffffffffe90;
  VectorBase<double> *in_stack_fffffffffffffe98;
  SVectorBase<double> *in_stack_fffffffffffffea0;
  SPxSolverBase<double> *in_stack_ffffffffffffff98;
  SPxVectorST<double> *in_stack_ffffffffffffffa0;
  int local_18;
  int local_14;
  
  VectorBase<double>::VectorBase((VectorBase<double> *)0x2dd284);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x2dd291);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x2dd2a0);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dd2af);
  VectorBase<double>::reDim
            ((VectorBase<double> *)in_stack_fffffffffffffea0,
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2dd2e0);
  VectorBase<double>::reDim
            ((VectorBase<double> *)in_stack_fffffffffffffea0,
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2dd311);
  VectorBase<double>::reDim
            ((VectorBase<double> *)in_stack_fffffffffffffea0,
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
  pdVar1 = VectorBase<double>::get_ptr((VectorBase<double> *)0x2dd342);
  SPxLPBase<double>::lhs((SPxLPBase<double> *)0x2dd357);
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2dd36e);
  SPxLPBase<double>::rhs((SPxLPBase<double> *)0x2dd383);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2dd39a);
  SPxLPBase<double>::upper((SPxLPBase<double> *)0x2dd3af);
  pdVar4 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2dd3c6);
  SPxLPBase<double>::lower((SPxLPBase<double> *)0x2dd3db);
  pdVar5 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2dd3f2);
  local_18 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dd407);
  while (local_18 = local_18 + -1, -1 < local_18) {
    SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    dVar7 = SVectorBase<double>::length2(in_stack_fffffffffffffe80);
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    *pdVar6 = dVar7;
    if (pdVar2[local_18] <= 0.0) {
      if (pdVar3[local_18] <= 0.0 && pdVar3[local_18] != 0.0) {
        VectorBase<double>::operator[]
                  ((VectorBase<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        VectorBase<double>::multAdd<double,double>
                  (in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80);
      }
    }
    else {
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      VectorBase<double>::multAdd<double,double>
                (in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
    }
  }
  local_14 = 0;
  while( true ) {
    VectorBase<double>::operator+=
              ((VectorBase<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_18 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2dd676);
    while (local_18 = local_18 + -1, -1 < local_18) {
      if (pdVar4[local_18] <= pdVar1[local_18] && pdVar1[local_18] != pdVar4[local_18]) {
        pdVar1[local_18] = pdVar4[local_18];
      }
      if (pdVar1[local_18] < pdVar5[local_18]) {
        pdVar1[local_18] = pdVar5[local_18];
      }
    }
    if (0xb < local_14) break;
    VectorBase<double>::clear((VectorBase<double> *)in_stack_fffffffffffffe80);
    local_18 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dd77f);
    while (local_18 = local_18 + -1, -1 < local_18) {
      SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      in_stack_fffffffffffffea0 =
           (SVectorBase<double> *)
           SVectorBase<double>::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (pdVar2[local_18] <= (double)in_stack_fffffffffffffea0) {
        if (pdVar3[local_18] < (double)in_stack_fffffffffffffea0) {
          in_stack_fffffffffffffe78 =
               (VectorBase<double> *)(pdVar3[local_18] - (double)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe80 =
               (SVectorBase<double> *)
               VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c)
          ;
          in_stack_fffffffffffffe70 =
               (SPxLPBase<double> *)
               SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          VectorBase<double>::multAdd<double,double>
                    (in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
        }
      }
      else {
        in_stack_fffffffffffffe90 =
             (VectorBase<double> *)(pdVar2[local_18] - (double)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe98 =
             (VectorBase<double> *)
             VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        in_stack_fffffffffffffe88 =
             SPxLPBase<double>::rowVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        VectorBase<double>::multAdd<double,double>
                  (in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80);
      }
    }
    local_14 = local_14 + 1;
  }
  SPxVectorST<double>::primal
            ((SPxVectorST<double> *)in_stack_fffffffffffffe70,
             (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SPxVectorST<double>::setupWeights(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x2dd9b7);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x2dd9c4);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x2dd9d1);
  return;
}

Assistant:

void SPxSumST<R>::setupWeights(SPxSolverBase<R>& base)
{
   int count;
   int i;
   R x;
   VectorBase<R> work, delta, rowLen;

   assert(base.nRows() > 0);
   assert(base.nCols() > 0);

   rowLen.reDim(base.nRows(), true);
   work.reDim(base.nCols(), true);
   delta.reDim(base.nCols(), true);

   R* wrk = work.get_ptr();
   const R* lhs = base.lhs().get_const_ptr();
   const R* rhs = base.rhs().get_const_ptr();
   const R* up = base.upper().get_const_ptr();
   const R* low = base.lower().get_const_ptr();

   for(i = base.nRows(); --i >= 0;)
   {
      rowLen[i] = base.rowVector(i).length2();

      if(lhs[i] > 0)
         delta.multAdd(lhs[i] / rowLen[i], base.rowVector(i));
      else if(rhs[i] < 0)
         delta.multAdd(rhs[i] / rowLen[i], base.rowVector(i));
   }

   for(count = 0;; count++)
   {
      work += delta;

      for(i = base.nCols(); --i >= 0;)
      {
         if(wrk[i] > up[i])
            wrk[i] = up[i];

         if(wrk[i] < low[i])
            wrk[i] = low[i];
      }

      //      std::cout << -(work * base.maxObj()) << std::endl;
      if(count >= 12)
         break;

      delta.clear();

      for(i = base.nRows(); --i >= 0;)
      {
         x = base.rowVector(i) * work;

         if(lhs[i] > x)
            delta.multAdd((lhs[i] - x) / rowLen[i], base.rowVector(i));
         else if(rhs[i] < x)
            delta.multAdd((rhs[i] - x) / rowLen[i], base.rowVector(i));
      }
   }

   this->primal(work);
   SPxVectorST<R>::setupWeights(base);
}